

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::ChangeRPath
               (string *file,string *oldRPath,string *newRPath,string *emsg,bool *changed)

{
  string *this;
  unsigned_long uVar1;
  int iVar2;
  char *pcVar3;
  bool *pbVar4;
  bool bVar5;
  long lVar6;
  StringEntry *pSVar7;
  StringEntry *pSVar8;
  char *pcVar9;
  size_type sVar10;
  size_t sVar11;
  long *plVar12;
  ostream *poVar13;
  undefined1 *puVar14;
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  string *psVar19;
  bool bVar20;
  char *se_name [2];
  StringEntry *se [2];
  cmELF elf;
  ostringstream e;
  cmSystemToolsRPathInfo rp [2];
  undefined1 local_388 [4];
  uint local_384;
  ulong local_380;
  string *local_378;
  string *local_370;
  string *local_368;
  char *local_360;
  string *local_358;
  bool *local_350;
  char *local_348 [2];
  StringEntry *local_338 [2];
  cmELF local_328;
  ulong local_300;
  long *local_2f8 [2];
  long local_2e8 [2];
  long *local_2d8;
  filebuf local_2d0 [8];
  long local_2c8 [2];
  byte abStack_2b8 [80];
  ios_base local_268 [136];
  ios_base local_1e0 [264];
  pointer local_d8 [2];
  ulong local_c8 [2];
  undefined1 local_b8 [16];
  string local_a8 [8];
  ulong local_a0 [11];
  long local_48 [3];
  
  if (changed != (bool *)0x0) {
    *changed = false;
  }
  lVar6 = 0xa0;
  puVar14 = local_b8;
  do {
    *(undefined1 **)(puVar14 + -0x10) = puVar14;
    *(undefined8 *)(puVar14 + -8) = 0;
    *puVar14 = 0;
    *(undefined1 **)(puVar14 + 0x10) = puVar14 + 0x20;
    *(undefined8 *)(puVar14 + 0x18) = 0;
    puVar14[0x20] = 0;
    puVar14 = puVar14 + 0x50;
    lVar6 = lVar6 + -0x50;
  } while (lVar6 != 0);
  local_378 = newRPath;
  local_370 = oldRPath;
  cmELF::cmELF(&local_328,(file->_M_dataplus)._M_p);
  local_338[0] = (StringEntry *)0x0;
  local_338[1] = (StringEntry *)0x0;
  local_348[0] = (char *)0x0;
  local_348[1] = (char *)0x0;
  pSVar7 = cmELF::GetRPath(&local_328);
  if (pSVar7 != (StringEntry *)0x0) {
    local_348[0] = "RPATH";
    local_338[0] = pSVar7;
  }
  uVar18 = (uint)(pSVar7 != (StringEntry *)0x0);
  local_350 = changed;
  pSVar8 = cmELF::GetRunPath(&local_328);
  if (pSVar8 == (StringEntry *)0x0) {
    uVar16 = 1;
    pcVar9 = (char *)0x0;
    if (pSVar7 == (StringEntry *)0x0) {
      bVar5 = local_378->_M_string_length == 0;
      if (emsg != (string *)0x0 && !bVar5) {
        std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x1c2407);
        std::__cxx11::string::_M_append((char *)emsg,(ulong)local_328.ErrorMessage._M_dataplus._M_p)
        ;
      }
      cmELF::~cmELF(&local_328);
      goto LAB_0012d0ed;
    }
  }
  else {
    uVar16 = (ulong)(uVar18 * 8);
    *(StringEntry **)((long)local_338 + uVar16) = pSVar8;
    pcVar9 = "RUNPATH";
    *(char **)((long)local_348 + uVar16) = "RUNPATH";
    uVar16 = (ulong)(uVar18 + 1);
  }
  local_384 = (uint)CONCAT71((int7)((ulong)pcVar9 >> 8),1);
  uVar17 = 0;
  uVar18 = 0;
  local_300 = uVar16;
  local_368 = emsg;
  local_358 = file;
  do {
    if (uVar18 == 0) {
      pSVar7 = local_338[uVar17];
LAB_0012cb65:
      local_380 = CONCAT44(local_380._4_4_,uVar18);
      sVar10 = cmSystemToolsFindRPath(&pSVar7->Value,local_370);
      if (sVar10 == 0xffffffffffffffff) {
        sVar10 = cmSystemToolsFindRPath(&pSVar7->Value,local_378);
        if (sVar10 == 0xffffffffffffffff) {
          if (emsg != (string *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_2d8,"The current ",0xc);
            pcVar9 = local_348[uVar17];
            if (pcVar9 == (char *)0x0) {
              std::ios::clear((int)local_388 + (int)local_2d8[-3] + 0xb0);
            }
            else {
              sVar11 = strlen(pcVar9);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_2d8,pcVar9,sVar11);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2d8," is:\n",5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2d8,"  ",2);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_2d8,(pSVar7->Value)._M_dataplus._M_p,
                                 (pSVar7->Value)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,"which does not contain:\n",0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"  ",2);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,(local_370->_M_dataplus)._M_p,local_370->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"as was expected.",0x10);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=((string *)emsg,(string *)local_2f8);
            if (local_2f8[0] != local_2e8) {
              operator_delete(local_2f8[0],local_2e8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d8);
            std::ios_base::~ios_base(local_268);
          }
          goto LAB_0012d0e1;
        }
        local_384 = 0;
        uVar18 = (uint)local_380;
      }
      else {
        lVar6 = (long)(int)(uint)local_380;
        uVar1 = pSVar7->Size;
        local_d8[lVar6 * 10] = (pointer)pSVar7->Position;
        local_c8[lVar6 * 10 + -1] = uVar1;
        pcVar9 = local_348[uVar17];
        local_360 = (char *)local_c8[lVar6 * 10 + 1];
        strlen(pcVar9);
        pcVar3 = local_360;
        local_360 = pcVar9;
        std::__cxx11::string::_M_replace((ulong)(local_c8 + lVar6 * 10),0,pcVar3,(ulong)pcVar9);
        std::__cxx11::string::substr((ulong)&local_2d8,(ulong)pSVar7);
        this = local_a8 + lVar6 * 0x50;
        std::__cxx11::string::operator=(this,(string *)&local_2d8);
        if (local_2d8 != local_2c8) {
          operator_delete(local_2d8,local_2c8[0] + 1);
        }
        std::__cxx11::string::_M_append((char *)this,(ulong)(local_378->_M_dataplus)._M_p);
        std::__cxx11::string::substr((ulong)&local_2d8,(ulong)pSVar7);
        std::__cxx11::string::_M_append((char *)this,(ulong)local_2d8);
        emsg = local_368;
        iVar2 = (uint)local_380;
        if (local_2d8 != local_2c8) {
          operator_delete(local_2d8,local_2c8[0] + 1);
        }
        uVar16 = local_a0[lVar6 * 10];
        if (local_c8[lVar6 * 10 + -1] < uVar16 + 1) {
          if (emsg != (string *)0x0) {
            std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x1c247d);
            std::__cxx11::string::append((char *)emsg);
            std::__cxx11::string::append((char *)emsg);
          }
LAB_0012d0e1:
          cmELF::~cmELF(&local_328);
          bVar5 = false;
          goto LAB_0012d0ed;
        }
        local_384 = (uint)CONCAT71((int7)(uVar16 >> 8),uVar16 == 0 & (byte)local_384);
        uVar16 = local_300;
        uVar18 = iVar2 + 1;
      }
    }
    else {
      pSVar7 = local_338[uVar17];
      if (local_d8[0] != (pointer)pSVar7->Position) goto LAB_0012cb65;
    }
    uVar17 = uVar17 + 1;
  } while (uVar16 != uVar17);
  cmELF::~cmELF(&local_328);
  bVar5 = true;
  if (uVar18 != 0) {
    if ((local_384 & 1) == 0) {
      std::ofstream::ofstream(&local_2d8,(local_358->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
      if ((abStack_2b8[local_2d8[-3]] & 5) == 0) {
        if (0 < (int)uVar18) {
          local_380 = (ulong)uVar18;
          uVar16 = 0;
          do {
            plVar12 = (long *)std::ostream::seekp((ostream *)&local_2d8,local_d8[uVar16 * 10],0);
            psVar19 = local_368;
            if ((*(byte *)((long)plVar12 + *(long *)(*plVar12 + -0x18) + 0x20) & 5) != 0) {
              if (local_368 == (string *)0x0) {
LAB_0012d1b4:
                bVar15 = 1;
              }
              else {
                std::__cxx11::string::operator=((string *)local_368,"Error seeking to ");
                std::__cxx11::string::_M_append((char *)psVar19,local_c8[uVar16 * 10]);
LAB_0012d1a8:
                bVar15 = 1;
                std::__cxx11::string::append((char *)psVar19);
              }
              goto LAB_0012d1b6;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_2d8,*(char **)(local_a8 + uVar16 * 0x50),
                       local_a0[uVar16 * 10]);
            for (uVar17 = local_a0[uVar16 * 10]; psVar19 = local_368,
                uVar17 < local_c8[uVar16 * 10 + -1]; uVar17 = uVar17 + 1) {
              local_328.Internal._0_1_ = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_2d8,(char *)&local_328,1);
            }
            if ((abStack_2b8[local_2d8[-3]] & 5) != 0) {
              if (local_368 == (string *)0x0) goto LAB_0012d1b4;
              std::__cxx11::string::operator=((string *)local_368,"Error writing the new ");
              std::__cxx11::string::_M_append((char *)psVar19,local_c8[uVar16 * 10]);
              goto LAB_0012d1a8;
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != local_380);
        }
        bVar15 = 0;
      }
      else {
        bVar15 = 1;
        if (emsg != (string *)0x0) {
          std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x1c24af);
        }
      }
LAB_0012d1b6:
      pbVar4 = local_350;
      bVar20 = local_350 == (bool *)0x0;
      local_2d8 = _VTT;
      *(undefined8 *)(local_2d0 + _VTT[-3] + -8) = ___throw_bad_array_new_length;
      std::filebuf::~filebuf(local_2d0);
      std::ios_base::~ios_base(local_1e0);
      if (bVar20 || bVar15 != 0) {
        bVar5 = (bool)(bVar15 ^ 1);
      }
      else {
        *pbVar4 = true;
      }
    }
    else {
      bVar5 = RemoveRPath(local_358,emsg,local_350);
    }
  }
LAB_0012d0ed:
  lVar6 = -0xa0;
  plVar12 = local_48;
  do {
    if (plVar12 != (long *)plVar12[-2]) {
      operator_delete((long *)plVar12[-2],*plVar12 + 1);
    }
    if (plVar12 + -4 != (long *)plVar12[-6]) {
      operator_delete((long *)plVar12[-6],plVar12[-4] + 1);
    }
    plVar12 = plVar12 + -10;
    lVar6 = lVar6 + 0x50;
  } while (lVar6 != 0);
  return bVar5;
}

Assistant:

bool cmSystemTools::ChangeRPath(std::string const& file,
                                std::string const& oldRPath,
                                std::string const& newRPath, std::string* emsg,
                                bool* changed)
{
#if defined(CMAKE_USE_ELF_PARSER)
  if (changed) {
    *changed = false;
  }
  int rp_count = 0;
  bool remove_rpath = true;
  cmSystemToolsRPathInfo rp[2];
  {
    // Parse the ELF binary.
    cmELF elf(file.c_str());

    // Get the RPATH and RUNPATH entries from it.
    int se_count = 0;
    cmELF::StringEntry const* se[2] = { CM_NULLPTR, CM_NULLPTR };
    const char* se_name[2] = { CM_NULLPTR, CM_NULLPTR };
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      se[se_count] = se_rpath;
      se_name[se_count] = "RPATH";
      ++se_count;
    }
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      se[se_count] = se_runpath;
      se_name[se_count] = "RUNPATH";
      ++se_count;
    }
    if (se_count == 0) {
      if (newRPath.empty()) {
        // The new rpath is empty and there is no rpath anyway so it is
        // okay.
        return true;
      }
      if (emsg) {
        *emsg = "No valid ELF RPATH or RUNPATH entry exists in the file; ";
        *emsg += elf.GetErrorMessage();
      }
      return false;
    }

    for (int i = 0; i < se_count; ++i) {
      // If both RPATH and RUNPATH refer to the same string literal it
      // needs to be changed only once.
      if (rp_count && rp[0].Position == se[i]->Position) {
        continue;
      }

      // Make sure the current rpath contains the old rpath.
      std::string::size_type pos =
        cmSystemToolsFindRPath(se[i]->Value, oldRPath);
      if (pos == std::string::npos) {
        // If it contains the new rpath instead then it is okay.
        if (cmSystemToolsFindRPath(se[i]->Value, newRPath) !=
            std::string::npos) {
          remove_rpath = false;
          continue;
        }
        if (emsg) {
          std::ostringstream e;
          /* clang-format off */
        e << "The current " << se_name[i] << " is:\n"
          << "  " << se[i]->Value << "\n"
          << "which does not contain:\n"
          << "  " << oldRPath << "\n"
          << "as was expected.";
          /* clang-format on */
          *emsg = e.str();
        }
        return false;
      }

      // Store information about the entry in the file.
      rp[rp_count].Position = se[i]->Position;
      rp[rp_count].Size = se[i]->Size;
      rp[rp_count].Name = se_name[i];

      std::string::size_type prefix_len = pos;

      // If oldRPath was at the end of the file's RPath, and newRPath is empty,
      // we should remove the unnecessary ':' at the end.
      if (newRPath.empty() && pos > 0 && se[i]->Value[pos - 1] == ':' &&
          pos + oldRPath.length() == se[i]->Value.length()) {
        prefix_len--;
      }

      // Construct the new value which preserves the part of the path
      // not being changed.
      rp[rp_count].Value = se[i]->Value.substr(0, prefix_len);
      rp[rp_count].Value += newRPath;
      rp[rp_count].Value += se[i]->Value.substr(pos + oldRPath.length());

      if (!rp[rp_count].Value.empty()) {
        remove_rpath = false;
      }

      // Make sure there is enough room to store the new rpath and at
      // least one null terminator.
      if (rp[rp_count].Size < rp[rp_count].Value.length() + 1) {
        if (emsg) {
          *emsg = "The replacement path is too long for the ";
          *emsg += se_name[i];
          *emsg += " entry.";
        }
        return false;
      }

      // This entry is ready for update.
      ++rp_count;
    }
  }

  // If no runtime path needs to be changed, we are done.
  if (rp_count == 0) {
    return true;
  }

  // If the resulting rpath is empty, just remove the entire entry instead.
  if (remove_rpath) {
    return cmSystemTools::RemoveRPath(file, emsg, changed);
  }

  {
    // Open the file for update.
    cmsys::ofstream f(file.c_str(),
                      std::ios::in | std::ios::out | std::ios::binary);
    if (!f) {
      if (emsg) {
        *emsg = "Error opening file for update.";
      }
      return false;
    }

    // Store the new RPATH and RUNPATH strings.
    for (int i = 0; i < rp_count; ++i) {
      // Seek to the RPATH position.
      if (!f.seekp(rp[i].Position)) {
        if (emsg) {
          *emsg = "Error seeking to ";
          *emsg += rp[i].Name;
          *emsg += " position.";
        }
        return false;
      }

      // Write the new rpath.  Follow it with enough null terminators to
      // fill the string table entry.
      f << rp[i].Value;
      for (unsigned long j = rp[i].Value.length(); j < rp[i].Size; ++j) {
        f << '\0';
      }

      // Make sure it wrote correctly.
      if (!f) {
        if (emsg) {
          *emsg = "Error writing the new ";
          *emsg += rp[i].Name;
          *emsg += " string to the file.";
        }
        return false;
      }
    }
  }

  // Everything was updated successfully.
  if (changed) {
    *changed = true;
  }
  return true;
#else
  (void)file;
  (void)oldRPath;
  (void)newRPath;
  (void)emsg;
  (void)changed;
  return false;
#endif
}